

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_map_init(size_t allocation_len,wally_map *output)

{
  wally_map_item *pwVar1;
  
  if (output == (wally_map *)0x0) {
    return -2;
  }
  wally_clear(output,0x18);
  if (allocation_len != 0) {
    pwVar1 = (wally_map_item *)wally_calloc(allocation_len << 5);
    output->items = pwVar1;
    if (pwVar1 == (wally_map_item *)0x0) {
      return -3;
    }
  }
  output->items_allocation_len = allocation_len;
  return 0;
}

Assistant:

int wally_map_init(size_t allocation_len, struct wally_map *output)
{
    if (!output)
        return WALLY_EINVAL;

    wally_clear(output, sizeof(*output));
    if (allocation_len) {
        output->items = wally_calloc(allocation_len * sizeof(*output->items));
        if (!output->items)
            return WALLY_ENOMEM;
    }
    output->items_allocation_len = allocation_len;
    return WALLY_OK;
}